

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O1

void monster_turn(monster *mon)

{
  bitflag *pbVar1;
  uint32_t *puVar2;
  ushort uVar3;
  short sVar4;
  monster_group_role mVar5;
  loc grid;
  loc grid_00;
  loc grid1;
  loc grid1_00;
  loc grid1_01;
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  loc grid1_02;
  loc grid_01;
  loc grid_02;
  monster_race *pmVar8;
  loc grid_03;
  loc grid1_03;
  loc grid1_04;
  artifact *paVar9;
  object *obj;
  chunk_conflict *pcVar10;
  _Bool _Var11;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  wchar_t wVar15;
  wchar_t wVar16;
  wchar_t wVar17;
  undefined4 uVar22;
  trap_kind_conflict *ptVar23;
  loc lVar24;
  _Bool _Var12;
  uint8_t uVar13;
  uint32_t uVar18;
  errr eVar19;
  square *psVar25;
  monster_lore *pmVar26;
  monster_conflict *pmVar27;
  loc lVar28;
  _Bool _Var14;
  loc grid_04;
  uint32_t uVar20;
  uint uVar21;
  loc_conflict lVar29;
  loc grid_05;
  ulong uVar30;
  undefined8 extraout_RAX;
  undefined7 extraout_var;
  undefined7 uVar35;
  undefined7 extraout_var_00;
  monster *pmVar31;
  monster *pmVar32;
  undefined7 extraout_var_01;
  object *poVar33;
  object *poVar34;
  undefined8 extraout_RAX_00;
  uint uVar36;
  char *pcVar37;
  loc *plVar38;
  long lVar39;
  byte bVar40;
  wchar_t amount;
  int iVar41;
  int iVar42;
  int x;
  ulong uVar43;
  byte bVar44;
  wchar_t wVar45;
  loc lVar46;
  loc lVar47;
  loc lVar48;
  wchar_t tmp;
  bool bVar49;
  _Bool dead;
  char m_name [80];
  char ghost_name [80];
  _Bool local_1109;
  loc local_1108;
  loc local_1100;
  char local_10f1;
  loc local_10f0;
  uint local_10e8;
  uint32_t local_10e4;
  loc local_10e0;
  uint local_10d4;
  loc local_10d0;
  undefined8 local_10c8;
  uint local_10bc;
  ulong local_10b8;
  loc local_10b0;
  loc local_10a8;
  monster_lore *local_10a0;
  object *local_1098;
  wchar_t local_1090;
  wchar_t local_108c;
  undefined2 local_1088;
  undefined1 local_1086;
  loc local_1038 [513];
  
  local_10a0 = get_lore(mon->race);
  local_1109 = false;
  monster_desc((char *)&local_1088,0x50,mon,L'̄');
  lVar24.x = (mon->grid).x;
  lVar24.y = (mon->grid).y;
  _Var11 = square_iswebbed(cave,lVar24);
  if (_Var11) {
    _Var11 = monster_is_visible(mon);
    if (_Var11) {
      pbVar1 = local_10a0->flags;
      flag_on_dbg(pbVar1,0xc,0x40,"lore->flags","RF_CLEAR_WEB");
      flag_on_dbg(pbVar1,0xc,0x41,"lore->flags","RF_PASS_WEB");
    }
    _Var11 = flag_has_dbg(mon->race->flags,0xc,0x41,"mon->race->flags","RF_PASS_WEB");
    if (!_Var11) {
      _Var11 = monster_is_visible(mon);
      if (_Var11) {
        pbVar1 = local_10a0->flags;
        flag_on_dbg(pbVar1,0xc,0x39,"lore->flags","RF_PASS_WALL");
        flag_on_dbg(pbVar1,0xc,0x3a,"lore->flags","RF_KILL_WALL");
      }
      _Var11 = flag_has_dbg(mon->race->flags,0xc,0x39,"mon->race->flags","RF_PASS_WALL");
      if (!_Var11) {
        _Var11 = monster_passes_walls(mon);
        if (!_Var11) {
          _Var11 = flag_has_dbg(mon->race->flags,0xc,0x40,"mon->race->flags","RF_CLEAR_WEB");
          if (!_Var11) {
            return;
          }
          ptVar23 = lookup_trap("web");
          if (ptVar23 != (trap_kind_conflict *)0x0) {
            lVar28.x = (mon->grid).x;
            lVar28.y = (mon->grid).y;
            square_remove_all_traps_of_type((chunk *)cave,lVar28,ptVar23->tidx);
            return;
          }
          __assert_fail("web",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-move.c"
                        ,0x696,"void monster_turn(struct monster *)");
        }
        ptVar23 = lookup_trap("web");
        if (ptVar23 == (trap_kind_conflict *)0x0) {
          __assert_fail("web",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-move.c"
                        ,0x68f,"void monster_turn(struct monster *)");
        }
        grid.x = (mon->grid).x;
        grid.y = (mon->grid).y;
        square_remove_all_traps_of_type((chunk *)cave,grid,ptVar23->tidx);
      }
    }
  }
  _Var11 = flag_has_dbg(mon->race->flags,0xc,0x25,"mon->race->flags","RF_TERRITORIAL");
  if ((_Var11) && (wVar15 = level_topography((int)player->place), wVar15 != L'\a')) {
    wVar16 = distance(mon->home,mon->grid);
    wVar15 = mon->race->hearing;
    iVar41 = wVar15 * 5;
    iVar42 = wVar16 * 6;
    uVar36 = 6;
    do {
      iVar42 = iVar42 - wVar16;
      uVar36 = uVar36 - 1;
      if (iVar42 != iVar41 && SBORROW4(iVar42,iVar41) == iVar42 + wVar15 * -5 < 0)
      goto LAB_0017f821;
    } while (1 < uVar36);
    uVar36 = 0;
LAB_0017f821:
    mon->energy = (mon->energy - (char)uVar36) + '\x05';
    wVar17 = distance(mon->home,(mon->target).grid);
    wVar15 = mon->race->hearing;
    wVar16 = wVar15 * 5;
    if (wVar17 != wVar16 && SBORROW4(wVar17,wVar16) == wVar17 + wVar15 * -5 < 0) {
      (mon->target).grid = mon->home;
    }
  }
  monster_group_rouse(cave,mon);
  lVar24 = (loc)get_lore(mon->race);
  if ((cave->num_repro < (int)(uint)z_info->repro_monster_max) &&
     (player->upkeep->arena_level == false)) {
    iVar42 = 0;
    iVar41 = (mon->grid).y + -1;
    local_1100 = lVar24;
    do {
      x = (mon->grid).x + -2;
      do {
        pcVar10 = cave;
        x = x + 1;
        lVar24 = (loc)loc(x,iVar41);
        psVar25 = square(pcVar10,lVar24);
        lVar24 = local_1100;
        iVar42 = iVar42 + (uint)(0 < psVar25->mon);
      } while (x <= (mon->grid).x);
      bVar49 = iVar41 <= (mon->grid).y;
      iVar41 = iVar41 + 1;
    } while (bVar49);
    if ((iVar42 < 4) &&
       ((iVar42 == 0 || (uVar18 = Rand_div(iVar42 * (uint)z_info->repro_monster_rate), uVar18 == 0))
       )) {
      _Var11 = monster_is_visible(mon);
      if (_Var11) {
        flag_on_dbg((bitflag *)((long)lVar24 + 0x20),0xc,0x17,"lore->flags","RF_MULTIPLY");
      }
      _Var11 = flag_has_dbg(mon->race->flags,0xc,0x17,"mon->race->flags","RF_MULTIPLY");
      if ((_Var11) && (_Var11 = multiply_monster(mon), _Var11)) {
        _Var11 = monster_is_visible(mon);
        if (!_Var11) {
          return;
        }
        sound(0x9a);
        return;
      }
    }
  }
  uVar18 = Rand_div(0x10);
  if ((((uVar18 == 0) &&
       (_Var11 = flag_has_dbg(mon->race->flags,0xc,0x27,"mon->race->flags","RF_SPEAKING"), _Var11))
      && (_Var11 = los(cave,mon->grid,player->grid), _Var11)) && (mon->m_timed[3] == 0)) {
    _Var11 = monster_is_visible(mon);
    if (_Var11) {
      monster_desc((char *)&local_1088,0x50,mon,L'Ā');
    }
    else {
      local_1086 = 0;
      local_1088 = 0x7449;
    }
    eVar19 = get_rnd_line("bravado.txt",(char *)local_1038);
    if (eVar19 == 0) {
      msg("%s %s",&local_1088,local_1038);
    }
  }
  else {
    _Var11 = flag_has_dbg(mon->race->flags,0xc,2,"mon->race->flags","RF_PLAYER_GHOST");
    if (_Var11) {
      if (cave->ghost == (ghost_info *)0x0) {
        __assert_fail("cave->ghost",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-move.c"
                      ,0x6cd,"void monster_turn(struct monster *)");
      }
      grid_00.x = (mon->grid).x;
      grid_00.y = (mon->grid).y;
      _Var11 = square_isview(cave,grid_00);
      if (((_Var11) && (cave->ghost->string_type == L'\x01')) &&
         ((cave->ghost->has_spoken == false && (uVar18 = Rand_div(3), uVar18 == 0)))) {
        monster_desc((char *)local_1038,0x50,mon,L'\x80');
        msg("%s says: \'%s\'",local_1038,cave->ghost->string);
        cave->ghost->has_spoken = true;
      }
    }
  }
  _Var11 = make_ranged_attack((monster_conflict *)mon);
  if (_Var11) {
    return;
  }
  pmVar26 = get_lore(mon->race);
  wVar15 = monster_effect_level(mon,L'\x02');
  uVar43 = 0;
  for (; iVar41 = (int)uVar43, wVar15 != L'\0'; wVar15 = wVar15 + L'\xffffffff') {
    iVar41 = (int)((ulong)((long)((100 - iVar41) * 0x46) * -0x51eb851f) >> 0x20);
    uVar43 = (ulong)(((iVar41 >> 5) - (iVar41 >> 0x1f)) + 100);
  }
  _Var11 = flag_has_dbg(mon->race->flags,0xc,0x1c,"mon->race->flags","RF_RAND_25");
  uVar30 = uVar43;
  if (_Var11) {
    uVar30 = (ulong)(iVar41 + 0x19);
    _Var11 = monster_is_visible(mon);
    if (_Var11) {
      flag_on_dbg(pmVar26->flags,0xc,0x1c,"lore->flags","RF_RAND_25");
    }
  }
  iVar42 = (int)uVar30;
  _Var11 = flag_has_dbg(mon->race->flags,0xc,0x1d,"mon->race->flags","RF_RAND_50");
  if (_Var11) {
    iVar42 = iVar42 + 0x32;
    _Var11 = monster_is_visible(mon);
    if (_Var11) {
      flag_on_dbg(pmVar26->flags,0xc,0x1d,"lore->flags","RF_RAND_50");
    }
  }
  local_10e4 = Rand_div(100);
  local_10f1 = iVar42 <= (int)local_10e4 && iVar41 <= (int)local_10e4;
  local_10b8 = uVar43;
  if (iVar42 <= (int)local_10e4 && iVar41 <= (int)local_10e4) {
    local_1100 = monster_target_loc((monster_conflict *)mon);
    _Var11 = flag_has_dbg(mon->race->flags,0xc,5,"mon->race->flags","RF_GROUP_AI");
    lVar24 = (loc)loc(0,0);
    uVar36 = (uint)z_info->flee_range + (uint)z_info->max_sight;
    if ((mon->m_timed[3] != 0) ||
       (_Var12 = flag_has_dbg(mon->race->flags,0xc,0x19,"mon->race->flags","RF_FRIGHTENED"), _Var12)
       ) {
LAB_0017fd8b:
      mon->min_range = (uint8_t)uVar36;
LAB_0017fd92:
      if (mon->min_range < uVar36) {
        _Var12 = flag_has_dbg(mon->race->flags,0xc,0x1b,"mon->race->flags","RF_NEVER_MOVE");
        if (_Var12) {
          mon->min_range = mon->min_range + '\x03';
        }
        _Var12 = flag_has_dbg(mon->race->flags,0xc,0x1a,"mon->race->flags","RF_NEVER_BLOW");
        if (_Var12) {
          mon->min_range = mon->min_range + '\x03';
        }
      }
      uVar21 = uVar36;
      if ((uVar36 <= mon->min_range) || (uVar21 = 1, (ushort)mon->cdis < z_info->turn_range)) {
        mon->min_range = (uint8_t)uVar21;
      }
      mon->best_range = mon->min_range;
      _Var12 = monster_loves_archery(mon);
      if (_Var12) {
        mon->best_range = mon->best_range + '\x03';
      }
      if (mon->race->freq_innate < L'\x19') {
        if (L'\x18' < mon->race->freq_spell) {
          uVar13 = mon->best_range + '\x03';
          goto LAB_0017fea5;
        }
      }
      else {
        _Var12 = monster_breathes(mon);
        if ((_Var12) &&
           ((short)((uint)(int)(short)(mon->maxhp - (mon->maxhp >> 0xf)) >> 1) < mon->hp)) {
          uVar13 = mon->best_range + (mon->best_range == '\0');
LAB_0017fea5:
          mon->best_range = uVar13;
        }
      }
    }
    else {
      mVar5 = mon->group_info[0].role;
      mon->min_range = '\x01';
      if (mVar5 == MON_GROUP_BODYGUARD) goto LAB_0017fd92;
      if (player->timed[0x30] == 0) {
        uVar3 = player->lev;
        uVar21 = mon->race->level + (mon->midx & 8U) + 0x19U & 0xffff;
        if ((uVar21 + 3 < (uint)uVar3) ||
           (((int)(uVar21 - 5) < (int)(uint)uVar3 &&
            ((uVar21 * (ushort)mon->maxhp + (uint)(ushort)mon->hp * 4) * (uint)(ushort)player->mhp <
             ((uint)uVar3 * (uint)(ushort)player->mhp + (uint)(ushort)player->chp * 4) *
             (uint)(ushort)mon->maxhp)))) goto LAB_0017fd8b;
        goto LAB_0017fd92;
      }
    }
    local_10e8 = uVar36;
    local_10a8 = lVar24;
    local_1108 = monster_target_loc((monster_conflict *)mon);
    if ((mon->group_info[0].role == MON_GROUP_BODYGUARD) &&
       (pmVar27 = (monster_conflict *)monster_group_leader(cave,mon),
       pmVar27 != (monster_conflict *)0x0)) {
      wVar15 = distance(mon->grid,(loc_conflict)pmVar27->grid);
      local_10f0.x = wVar15;
      if (wVar15 < L'\x02') goto LAB_00180013;
      _Var12 = los(cave,mon->grid,(loc_conflict)pmVar27->grid);
      if ((L'\n' < local_10f0.x) && (!_Var12)) goto LAB_00180013;
      local_10d0.x = L'\0';
      local_10d0.y = L'\0';
      lVar39 = 0;
      do {
        lVar24 = (loc)loc_sum(mon->grid,(loc_conflict)ddgrid_ddd[lVar39]);
        wVar15 = distance((loc_conflict)lVar24,(loc_conflict)pmVar27->grid);
        lVar28 = monster_target_loc(pmVar27);
        wVar16 = distance((loc_conflict)lVar24,(loc_conflict)lVar28);
        _Var12 = square_in_bounds(cave,lVar24);
        if ((_Var12) &&
           ((_Var12 = monster_can_kill(mon,(loc_conflict)lVar24), _Var12 ||
            (_Var12 = monster_can_move(mon,(loc_conflict)lVar24), _Var12)))) {
          _Var12 = monster_hates_grid(mon,(loc_conflict)lVar24);
          bVar49 = false;
          if ((!_Var12) && (wVar15 < local_10f0.x)) {
            bVar49 = wVar16 < (int)(uint)mon->cdis;
            local_10d0.x = L'\x01';
            local_10d0.y = L'\0';
            local_10e0 = lVar24;
          }
        }
        else {
          bVar49 = false;
        }
      } while ((!bVar49) && (bVar49 = lVar39 != 7, lVar39 = lVar39 + 1, bVar49));
      uVar43 = local_10b8;
      if (((ulong)local_10d0 & 1) == 0) goto LAB_00180013;
      (mon->target).grid.x = local_10e0.x;
      (mon->target).grid.y = local_10e0.y;
LAB_001801e0:
      local_10e0 = (loc)((ulong)local_10e0 & 0xffffffff00000000);
LAB_00180496:
      grid_04 = (loc)loc_diff((mon->target).grid,mon->grid);
      pcVar37 = "mon->mflag";
      flag_on_dbg(mon->mflag,2,10,"mon->mflag","MFLAG_TRACKING");
    }
    else {
LAB_00180013:
      local_10d0 = (loc)((ulong)local_1108 >> 0x20);
      _Var12 = monster_passes_walls(mon);
      if (_Var12) {
        lVar24 = monster_target_loc((monster_conflict *)mon);
        grid1.x = (mon->grid).x;
        grid1.y = (mon->grid).y;
        _Var12 = projectable((chunk *)cave,grid1,lVar24,L'\0');
        if (!_Var12) {
          uVar18 = Rand_div(99);
          if ((int)uVar18 < 5) goto LAB_001801a0;
          grid1_00.x = (mon->grid).x;
          grid1_00.y = (mon->grid).y;
          wVar15 = project_path((chunk *)cave,local_1038,(uint)z_info->max_sight,grid1_00,lVar24,
                                L'耀');
          if (L'\0' < wVar15) {
            lVar39 = 0;
            do {
              _Var12 = square_isperm(cave,local_1038[lVar39]);
              uVar43 = local_10b8;
              if (_Var12) goto LAB_001801a0;
              _Var14 = loc_eq((loc_conflict)local_1038[lVar39],(loc_conflict)lVar24);
            } while ((!_Var14) &&
                    (bVar49 = (ulong)(uint)wVar15 - 1 != lVar39, lVar39 = lVar39 + 1, bVar49));
            uVar43 = local_10b8;
            if (_Var12) goto LAB_001801a0;
          }
        }
LAB_001801ca:
        (mon->target).grid.x = local_1108.x;
        (mon->target).grid.y = local_10d0.x;
        goto LAB_001801e0;
      }
LAB_001801a0:
      pcVar10 = cave;
      if ((((mon->target).midx != -1) || (player->timed[0x2e] == 0)) ||
         (uVar3 = z_info->max_sight >> 2, pcVar37._2_6_ = 0, pcVar37._0_2_ = uVar3,
         mon->cdis <= uVar3)) {
        lVar24 = monster_target_loc((monster_conflict *)mon);
        grid1_01.x = (mon->grid).x;
        grid1_01.y = (mon->grid).y;
        pcVar37._0_4_ = L'\0';
        pcVar37._4_4_ = L'\0';
        _Var12 = projectable((chunk *)pcVar10,grid1_01,lVar24,L'\0');
        if (_Var12) goto LAB_001801ca;
      }
      wVar15 = (mon->target).midx;
      if (wVar15 == L'\xffffffff') {
        lVar46 = (loc)(cave->noise).grids;
        local_10e0 = (loc)(cave->scent).grids;
      }
      else if (wVar15 < L'\x01') {
        local_10e0 = (loc)0x0;
        lVar46.x = L'\0';
        lVar46.y = L'\0';
      }
      else {
        pmVar31 = cave_monster(cave,wVar15);
        lVar46 = (loc)(pmVar31->noise).grids;
        local_10e0 = (loc)0x0;
      }
      _Var12 = monster_can_hear(mon);
      if (_Var12) {
        pcVar37 = (char *)(long)(mon->grid).x;
        local_10bc = CONCAT22(local_10bc._2_2_,
                              (*(uint16_t **)((long)lVar46 + (long)(mon->grid).y * 8))
                              [(long)pcVar37]);
        local_10d4 = 0;
        local_10c8 = (bitflag *)((ulong)local_10c8._4_4_ << 0x20);
        lVar39 = 0;
        local_10b0 = lVar46;
        do {
          lVar24 = (loc)loc_sum(mon->grid,(loc_conflict)ddgrid_ddd[lVar39]);
          wVar15 = lVar24.x;
          local_10f0.x._0_2_ = (*(uint16_t **)((long)lVar46 + ((long)lVar24 >> 0x20) * 8))[wVar15];
          _Var12 = square_in_bounds(cave,lVar24);
          if (_Var12) {
            if ((((*(uint16_t **)((long)lVar46 + ((long)lVar24 >> 0x20) * 8))[wVar15] != 0) &&
                ((_Var12 = monster_can_kill(mon,(loc_conflict)lVar24), _Var12 ||
                 (_Var12 = monster_can_move(mon,(loc_conflict)lVar24), _Var12)))) &&
               (_Var12 = monster_hates_grid(mon,(loc_conflict)lVar24), !_Var12)) {
              pcVar37 = (char *)((ulong)lVar24 >> 0x20);
              bVar49 = true;
              if ((uint16_t)local_10f0.x < (ushort)local_10bc) {
                local_10c8 = (bitflag *)
                             CONCAT44(local_10c8._4_4_,(int)CONCAT71((uint7)local_10f0.x._1_1_,1));
                lVar46 = local_10b0;
                local_1108 = lVar24;
                local_10d0 = (loc)pcVar37;
                goto LAB_00180392;
              }
              if ((ushort)local_10bc == (uint16_t)local_10f0.x) {
                local_108c = lVar24.y;
                local_1090 = wVar15;
              }
              local_10d4 = local_10d4 & 0xff;
              pcVar37._0_4_ = L'\0';
              pcVar37._4_4_ = L'\0';
              if ((ushort)local_10bc == (uint16_t)local_10f0.x) {
                local_10d4 = 1;
              }
            }
            bVar49 = false;
            lVar46 = local_10b0;
          }
          else {
            bVar49 = false;
          }
LAB_00180392:
          uVar43 = local_10b8;
        } while ((!bVar49) && (bVar49 = lVar39 != 7, lVar39 = lVar39 + 1, bVar49));
      }
      else {
        local_10c8 = (bitflag *)((ulong)local_10c8._4_4_ << 0x20);
        local_10d4 = 0;
      }
      _Var12 = monster_can_smell(mon);
      if ((_Var12) && (((ulong)local_10c8 & 1) == 0)) {
        lVar39 = 0;
        uVar36 = 0;
        do {
          lVar24 = (loc)loc_sum(mon->grid,(loc_conflict)ddgrid_ddd[lVar39]);
          pcVar37 = *(char **)((long)local_10e0 + ((long)lVar24 >> 0x20) * 8);
          uVar3 = *(ushort *)((long)pcVar37 + (long)lVar24.x * 2);
          if (uVar3 != 0) {
            pcVar37._0_4_ = mon->race->smell - (uint)uVar3;
            pcVar37._4_4_ = L'\0';
            if ((int)uVar36 < (wchar_t)pcVar37) {
              local_10d0 = (loc)((ulong)lVar24 >> 0x20);
              local_10c8 = (bitflag *)
                           CONCAT44(local_10c8._4_4_,(int)CONCAT71(lVar24._1_7_ >> 0x20,1));
              uVar36 = (wchar_t)pcVar37;
              local_1108 = lVar24;
            }
          }
          lVar39 = lVar39 + 1;
        } while (lVar39 != 8);
      }
      if (((ulong)local_10c8 & 1) != 0) {
        (mon->target).grid.x = local_1108.x;
        (mon->target).grid.y = local_10d0.x;
        local_10e0.x = (int)CONCAT71(local_10d0._1_7_,1);
        goto LAB_00180496;
      }
      if ((local_10d4 & 1) != 0) {
        (mon->target).grid.x = local_1090;
        (mon->target).grid.y = local_108c;
        local_10e0.x = (int)CONCAT71((uint7)(uint3)((uint)local_108c >> 8),1);
        goto LAB_00180496;
      }
      pmVar31 = group_monster_tracking(cave,mon);
      if ((pmVar31 == (monster *)0x0) || (_Var12 = los(cave,mon->grid,pmVar31->grid), !_Var12)) {
        pcVar37 = "mon->mflag";
        _Var12 = flag_has_dbg(mon->mflag,2,10,"mon->mflag","MFLAG_TRACKING");
        grid_04 = local_10a8;
        if (_Var12) {
          grid_04 = (loc)loc_diff((mon->target).grid,mon->grid);
        }
        _Var12 = loc_is_zero((loc_conflict)grid_04);
        if (!_Var12) goto LAB_00180779;
        local_1038[2].x = L'\x04';
        local_1038[2].y = L'\x05';
        local_1038[3].x = L'\x06';
        local_1038[3].y = L'\a';
        local_1038[0].x = L'\0';
        local_1038[0].y = L'\x01';
        local_1038[1].x = L'\x02';
        local_1038[1].y = L'\x03';
        uVar30 = 8;
        local_1108 = (loc)mon->mflag;
        do {
          uVar18 = (uint32_t)uVar30;
          if ((int)uVar18 < 1) {
            local_10a8 = (loc)loc(0,0);
            break;
          }
          uVar20 = Rand_div(uVar18);
          wVar15 = (&local_1038[0].x)[(int)uVar20];
          local_10f0 = ddgrid_ddd[wVar15];
          lVar24 = (loc)loc_sum(mon->grid,(loc_conflict)local_10f0);
          _Var12 = square_is_monster_walkable(cave,lVar24);
          if ((!_Var12) || (_Var12 = monster_hates_grid(mon,(loc_conflict)lVar24), _Var12)) {
            uVar30 = (ulong)(uVar18 - 1);
            (&local_1038[0].x)[(int)uVar20] = (&local_1038[0].x)[uVar30];
            (&local_1038[0].x)[uVar30] = wVar15;
            bVar49 = true;
          }
          else {
            bVar49 = false;
            local_10a8 = local_10f0;
            pcVar37 = (char *)local_10f0;
          }
          uVar43 = local_10b8;
        } while (bVar49);
        flag_off((bitflag *)local_1108,2,10);
        local_10e0 = (loc)((ulong)local_10e0 & 0xffffffff00000000);
        grid_04 = local_10a8;
      }
      else {
        grid_04 = (loc)loc_diff(pmVar31->grid,mon->grid);
        flag_off(mon->mflag,2,10);
LAB_00180779:
        local_10e0 = (loc)((ulong)local_10e0 & 0xffffffff00000000);
      }
    }
    uVar36 = local_10e8;
    _Var12 = monster_taking_terrain_damage((chunk *)cave,(monster_conflict *)mon);
    if ((_Var12) && (_Var12 = get_move_find_safety(mon), _Var12)) {
      get_move_flee(mon);
      grid_04 = (loc)loc_diff((mon->target).grid,mon->grid);
      uVar30 = CONCAT71(SUB87(pcVar37,1),1);
    }
    else {
      uVar30 = 0;
    }
    if ((char)uVar30 == '\0' && _Var11) {
      local_10bc = (uint)uVar30;
      _Var12 = monster_passes_walls(mon);
      if (_Var12) {
        uVar30 = (ulong)local_10bc;
      }
      else {
        lVar39 = 0;
        iVar41 = 0;
        local_10a8 = grid_04;
        do {
          lVar24 = (loc)loc_sum((loc_conflict)local_1100,(loc_conflict)ddgrid_ddd[lVar39]);
          _Var12 = square_ispassable(cave,lVar24);
          if ((_Var12) || (_Var12 = square_isroom(cave,lVar24), _Var12)) {
            iVar41 = iVar41 + 1;
          }
          grid_04 = local_10a8;
          uVar36 = local_10e8;
          lVar39 = lVar39 + 1;
        } while (lVar39 != 8);
        wVar15 = (mon->target).midx;
        if (wVar15 == L'\xffffffff') {
          bVar49 = (short)((uint)(int)(short)(player->mhp - (player->mhp >> 0xf)) >> 1) <
                   player->chp;
        }
        else if (wVar15 < L'\x01') {
          bVar49 = false;
        }
        else {
          pmVar31 = cave_monster(cave,wVar15);
          bVar49 = pmVar31->hp < mon->hp;
        }
        uVar30 = (ulong)local_10bc;
        if ((iVar41 < 5) && (bVar49)) {
          local_10b0 = monster_target_loc((monster_conflict *)mon);
          wVar15 = distance((loc_conflict)local_10b0,mon->grid);
          iVar41 = wVar15 * 3 + 3;
          if (-1 < wVar15 * 3) {
            iVar41 = wVar15 * 3;
          }
          local_10c8 = (bitflag *)CONCAT44(local_10c8._4_4_,(iVar41 >> 2) + 2);
          local_10f0.x = L'ϧ';
          bVar40 = true;
          lVar47.x = L'\x01';
          lVar47.y = L'\0';
          do {
            local_10d4 = CONCAT31(local_10d4._1_3_,bVar40);
            local_1108 = (loc)loc(0,0);
            pwVar6 = dist_offsets_y[(long)lVar47];
            pwVar7 = dist_offsets_x[(long)lVar47];
            wVar15 = *pwVar6;
            wVar16 = *pwVar7;
            local_10d0 = lVar47;
            if (wVar16 != L'\0' || wVar15 != L'\0') {
              lVar39 = 4;
              do {
                lVar29 = loc(wVar16,wVar15);
                lVar24 = (loc)loc_sum(mon->grid,lVar29);
                _Var12 = square_in_bounds_fully(cave,lVar24);
                if ((((_Var12) && (_Var12 = square_isempty(cave,lVar24), _Var12)) &&
                    (_Var12 = square_isview(cave,lVar24), !_Var12)) &&
                   (grid1_02.x = (mon->grid).x, grid1_02.y = (mon->grid).y,
                   _Var12 = projectable((chunk *)cave,grid1_02,lVar24,L'\b'), _Var12)) {
                  wVar16 = distance((loc_conflict)lVar24,(loc_conflict)local_10b0);
                  bVar49 = wVar16 < local_10f0.x;
                  wVar15 = local_10f0.x;
                  if ((wchar_t)local_10c8 <= wVar16 && bVar49) {
                    wVar15 = wVar16;
                  }
                  local_10f0.x = wVar15;
                  if ((wchar_t)local_10c8 <= wVar16 && bVar49) {
                    local_1108 = lVar24;
                  }
                }
                wVar15 = *(wchar_t *)((long)pwVar6 + lVar39);
                wVar16 = *(wchar_t *)((long)pwVar7 + lVar39);
                lVar39 = lVar39 + 4;
              } while (wVar15 != L'\0' || wVar16 != L'\0');
            }
            uVar43 = local_10b8;
            uVar36 = local_10e8;
            if (local_10f0.x < L'ϧ') {
              (mon->target).grid.x = local_1108.x;
              (mon->target).grid.y = local_1108.y;
              bVar40 = (byte)local_10d4;
              break;
            }
            bVar40 = (ulong)local_10d0 < 9;
            lVar47 = (loc)((long)local_10d0 + 1);
          } while (lVar47 != (loc)0xa);
          uVar30 = (ulong)local_10bc;
          grid_04 = local_10a8;
          if ((bVar40 & 1) != 0) {
            grid_04 = (loc)loc_diff((mon->target).grid,mon->grid);
            flag_off(mon->mflag,2,10);
            uVar30 = 1;
          }
        }
      }
    }
    bVar40 = (byte)uVar30;
    if ((bVar40 == 0) && (uVar36 == mon->min_range)) {
      _Var12 = get_move_find_safety(mon);
      if (_Var12) {
        get_move_flee(mon);
        grid_04.x = (mon->grid).x;
        grid_04.y = (mon->grid).y;
        lVar29 = (mon->target).grid;
      }
      else {
        lVar29 = loc(0,0);
      }
      grid_04 = (loc)loc_diff(lVar29,(loc_conflict)grid_04);
      flag_off(mon->mflag,2,10);
      bVar40 = 1;
    }
    if (((bVar40 & 1) == 0 && _Var11) &&
       (grid_01.x = (mon->grid).x, grid_01.y = (mon->grid).y, _Var11 = square_isview(cave,grid_01),
       _Var11)) {
      if (mon->cdis < 2) {
        grid_05.x = (mon->target).grid.x;
        grid_05.y = (mon->target).grid.y;
      }
      else {
        uVar18 = Rand_div(8);
        iVar41 = 0;
        do {
          uVar21 = uVar18 + iVar41;
          uVar36 = uVar18 + 7 + iVar41;
          if (-1 < (int)uVar21) {
            uVar36 = uVar21;
          }
          grid_05 = (loc)loc_sum((loc_conflict)local_1100,
                                 (loc_conflict)ddgrid_ddd[(int)(uVar21 - (uVar36 & 0xfffffff8))]);
          _Var11 = square_isempty(cave,grid_05);
        } while ((!_Var11) && (bVar49 = iVar41 != 7, iVar41 = iVar41 + 1, bVar49));
      }
      grid_04 = (loc)loc_diff((loc_conflict)grid_05,mon->grid);
      uVar43 = local_10b8;
    }
    _Var11 = loc_is_zero((loc_conflict)grid_04);
    if (_Var11) {
      lVar39 = 0;
    }
    else {
      wVar16 = grid_04.y;
      wVar15 = -wVar16;
      if (-1 < (long)grid_04) {
        wVar15 = wVar16;
      }
      wVar45 = grid_04.x;
      wVar17 = -wVar45;
      if (L'\0' < wVar45) {
        wVar17 = wVar45;
      }
      if (wVar15 == wVar17 * 2 || SBORROW4(wVar15,wVar17 * 2) != wVar15 + wVar17 * -2 < 0) {
        if (wVar17 == wVar15 * 2 || SBORROW4(wVar17,wVar15 * 2) != wVar17 + wVar15 * -2 < 0) {
          if (wVar16 == L'\0' || (long)grid_04 < 0) {
            if (wVar45 < L'\x01') {
              if ((wVar15 < wVar17) || ((lVar39 = 7, wVar15 == wVar17 && (((byte)turn & 1) == 0))))
              {
                lVar39 = 0x11;
              }
            }
            else if ((wVar17 < wVar15) ||
                    ((lVar39 = 9, wVar15 == wVar17 && (((byte)turn & 1) == 0)))) {
              lVar39 = 0x13;
            }
          }
          else if (wVar45 < L'\x01') {
            if ((wVar17 < wVar15) || ((lVar39 = 1, wVar15 == wVar17 && (((byte)turn & 1) == 0)))) {
              lVar39 = 0xb;
            }
          }
          else if ((wVar15 < wVar17) || ((lVar39 = 3, wVar15 == wVar17 && (((byte)turn & 1) == 0))))
          {
            lVar39 = 0xd;
          }
        }
        else if (wVar45 < L'\x01') {
          if ((wVar16 != L'\0' && -1 < (long)grid_04) ||
             ((lVar39 = 4, (ulong)grid_04 >> 0x20 == 0 && (((byte)turn & 1) == 0)))) {
            lVar39 = 0xe;
          }
        }
        else if (((long)grid_04 < 0) ||
                ((lVar39 = 6, (ulong)grid_04 >> 0x20 == 0 && (((byte)turn & 1) == 0)))) {
          lVar39 = 0x10;
        }
      }
      else if (wVar16 == L'\0' || (long)grid_04 < 0) {
        if ((wVar45 < L'\0') || ((lVar39 = 8, wVar45 == L'\0' && (((byte)turn & 1) == 0)))) {
          lVar39 = 0x12;
        }
      }
      else if ((L'\0' < wVar45) || ((lVar39 = 2, wVar45 == L'\0' && (((byte)turn & 1) == 0)))) {
        lVar39 = 0xc;
      }
    }
    if (_Var11) {
      return;
    }
  }
  else {
    lVar39 = 0;
    local_10e0 = (loc)((ulong)local_10e0 & 0xffffffff00000000);
  }
  local_10e8 = CONCAT31(local_10e8._1_3_,(int)uVar43 <= (int)local_10e4);
  local_10e0 = (loc)((ulong)local_10e0 ^ 1);
  local_10a0 = (monster_lore *)local_10a0->flags;
  local_10b0 = (loc)(side_dirs + lVar39);
  local_10d0 = (loc)(CONCAT71(local_10d0._1_7_,local_10f1) ^ 1);
  lVar48.x = L'\0';
  lVar48.y = L'\0';
  local_1108 = (loc)((ulong)local_1108 & 0xffffffff00000000);
LAB_00180ab5:
  if (local_10f1 == '\0') {
    uVar18 = Rand_div(8);
    uVar30 = (ulong)ddd[(int)uVar18];
  }
  else {
    uVar30 = (ulong)((uint8_t *)local_10b0)[(long)lVar48];
  }
  plVar38 = ddgrid;
  local_1100 = (loc)loc_sum(mon->grid,(loc_conflict)ddgrid[uVar30]);
  if (lVar48 == (loc)0x0 || (char)local_10d0.x != '\0') {
LAB_00180b24:
    local_10f0 = lVar48;
    pmVar26 = get_lore(mon->race);
    lVar24 = local_1100;
    _Var12 = square_isplayer(cave,local_1100);
    _Var11 = true;
    if ((_Var12) || (_Var12 = square_isdecoyed(cave,lVar24), _Var12)) goto LAB_00180c6f;
    iVar41 = (int)uVar43;
    if (((int)local_10e4 < iVar41) ||
       (_Var12 = monster_hates_grid(mon,(loc_conflict)lVar24), !_Var12)) {
      _Var12 = square_ispassable(cave,lVar24);
      if (_Var12) {
        pmVar8 = mon->race;
        _Var12 = square_iswatery(cave,lVar24);
        if (_Var12) {
          pbVar1 = pmVar8->flags;
          plVar38 = (loc *)0x22d205;
          _Var12 = flag_has_dbg(pbVar1,0xc,0x22,"race->flags","RF_FLYING");
          _Var11 = true;
          if (!_Var12) {
            plVar38 = (loc *)0x238b1a;
            _Var12 = flag_has_dbg(pmVar8->spell_flags,0xd,9,"race->spell_flags","RSF_BR_FIRE");
            if (!_Var12) {
              plVar38 = (loc *)0x22d205;
              _Var12 = flag_has_dbg(pbVar1,0xc,0x46,"race->flags","RF_DEMON");
              if (!_Var12) {
                plVar38 = (loc *)0x22d205;
                _Var12 = flag_has_dbg(pbVar1,0xc,0x23,"race->flags","RF_HUMANOID");
                if (_Var12) {
                  uVar18 = Rand_div(4);
                  _Var11 = uVar18 != 0;
                }
                else {
                  plVar38 = (loc *)0x22d205;
                  _Var12 = flag_has_dbg(pbVar1,0xc,0x49,"race->flags","RF_UNDEAD");
                  if (_Var12) {
                    uVar18 = Rand_div(2);
                    _Var11 = uVar18 == 0;
                  }
                }
                goto LAB_00180c6f;
              }
            }
            _Var11 = false;
          }
        }
        else {
          _Var12 = square_isfiery(cave,lVar24);
          if (_Var12) {
            plVar38 = (loc *)0x22d205;
            _Var12 = flag_has_dbg(pmVar8->flags,0xc,0x52,"race->flags","RF_IM_FIRE");
            if (!_Var12) {
              plVar38 = (loc *)0x22d205;
              _Var12 = flag_has_dbg(pmVar8->flags,0xc,0x22,"race->flags","RF_FLYING");
              if ((!_Var12) || (mon->hp < 0x32)) goto LAB_00180c6c;
            }
          }
          else {
            _Var12 = square_isrubble(cave,lVar24);
            if (_Var12) {
              plVar38 = (loc *)0x22d205;
              _Var12 = flag_has_dbg(pmVar8->flags,0xc,0x39,"race->flags","RF_PASS_WALL");
              if (!_Var12) {
                plVar38 = (loc *)0x22d205;
                _Var12 = flag_has_dbg(pmVar8->flags,0xc,0x3a,"race->flags","RF_KILL_WALL");
                if (!_Var12) {
                  iVar41 = 0x3b;
                  pcVar37 = "RF_SMASH_WALL";
LAB_0018148f:
                  plVar38 = (loc *)0x22d205;
                  _Var12 = flag_has_dbg(pmVar8->flags,0xc,iVar41,"race->flags",pcVar37);
                  if (!_Var12) {
                    uVar18 = Rand_div(2);
                    _Var11 = uVar18 == 0;
                  }
                }
              }
            }
            else {
              _Var12 = square_istree(cave,lVar24);
              if (_Var12) {
                plVar38 = (loc *)0x22d205;
                _Var12 = flag_has_dbg(pmVar8->flags,0xc,0x39,"race->flags","RF_PASS_WALL");
                if (!_Var12) {
                  plVar38 = (loc *)0x22d205;
                  _Var12 = flag_has_dbg(pmVar8->flags,0xc,0x22,"race->flags","RF_FLYING");
                  if (!_Var12) {
                    iVar41 = 0x47;
                    pcVar37 = "RF_ANIMAL";
                    goto LAB_0018148f;
                  }
                }
              }
              else {
                _Var12 = square_isfall(cave,lVar24);
                if (_Var12) {
                  plVar38 = (loc *)0x22d205;
                  _Var11 = flag_has_dbg(pmVar8->flags,0xc,0x22,"race->flags","RF_FLYING");
                }
              }
            }
          }
        }
      }
      else {
        _Var12 = square_isperm(cave,lVar24);
        if (_Var12) {
joined_r0x00180c49:
          if ((int)local_10e4 < iVar41) {
            monster_display_confused_move_msg(mon,(char *)&local_1088,(loc_conflict)lVar24);
            monster_slightly_stun_by_move(mon);
            local_1108.x = (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          }
          goto LAB_00180c6c;
        }
        _Var12 = monster_is_visible(mon);
        if (_Var12) {
          pbVar1 = pmVar26->flags;
          flag_on_dbg(pbVar1,0xc,0x39,"lore->flags","RF_PASS_WALL");
          flag_on_dbg(pbVar1,0xc,0x3a,"lore->flags","RF_KILL_WALL");
          flag_on_dbg(pbVar1,0xc,0x3b,"lore->flags","RF_SMASH_WALL");
        }
        plVar38 = (loc *)0x22d200;
        _Var12 = flag_has_dbg(mon->race->flags,0xc,0x39,"mon->race->flags","RF_PASS_WALL");
        if (_Var12) goto LAB_00180c6f;
        plVar38 = (loc *)0x22d200;
        _Var12 = flag_has_dbg(mon->race->flags,0xc,0x3b,"mon->race->flags","RF_SMASH_WALL");
        if (_Var12) {
          square_smash_wall(cave,local_1100);
        }
        else {
          plVar38 = (loc *)0x22d200;
          _Var12 = flag_has_dbg(mon->race->flags,0xc,0x3a,"mon->race->flags","RF_KILL_WALL");
          lVar24 = local_1100;
          if (!_Var12) {
            _Var11 = square_iscloseddoor(cave,local_1100);
            if ((!_Var11) && (_Var11 = square_issecretdoor(cave,lVar24), !_Var11))
            goto joined_r0x00180c49;
            bVar49 = (int)local_10e4 < iVar41;
            _Var11 = flag_has_dbg(mon->race->flags,0xc,0x37,"mon->race->flags","RF_OPEN_DOOR");
            _Var12 = flag_has_dbg(mon->race->flags,0xc,0x38,"mon->race->flags","RF_BASH_DOOR");
            if (_Var12 && bVar49) {
              uVar18 = Rand_div(3);
              _Var12 = uVar18 == 0;
            }
            bVar40 = _Var11 & (byte)local_10e8;
            uVar36 = local_1108.x & 0xff;
            if (bVar40 != 0 || _Var12 != false) {
              uVar36 = 1;
            }
            plVar38 = (loc *)0x0;
            local_1108.x = uVar36;
            if ((iVar41 <= (int)local_10e4) && (_Var11 = monster_is_visible(mon), _Var11)) {
              local_10c8 = pmVar26->flags;
              flag_on_dbg(local_10c8,0xc,0x37,"lore->flags","RF_OPEN_DOOR");
              plVar38 = (loc *)0x238ae6;
              flag_on_dbg(local_10c8,0xc,0x38,"lore->flags","RF_BASH_DOOR");
            }
            if (bVar40 == 0) {
              bVar49 = true;
              if (_Var12 != false) goto LAB_00181a6e;
              if ((int)local_10e4 < iVar41) {
                monster_display_confused_move_msg(mon,(char *)&local_1088,(loc_conflict)local_1100);
                monster_slightly_stun_by_move(mon);
                local_1108.x = (int)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
                bVar40 = 0;
                bVar44 = 1;
              }
              else {
                bVar44 = 1;
                bVar40 = 0;
              }
            }
            else {
              if (_Var12 == false) {
                bVar49 = false;
              }
              else {
                uVar18 = Rand_div(2);
                bVar49 = uVar18 == 0;
              }
LAB_00181a6e:
              lVar24 = local_1100;
              _Var11 = square_islockeddoor(cave,local_1100);
              if (_Var11) {
                wVar15 = square_door_power((chunk *)cave,lVar24);
                wVar16 = Rand_div((int)mon->hp / 10);
                bVar40 = (byte)wVar16;
                if (wVar15 < wVar16) {
                  pcVar37 = "%s fiddles with the lock.";
                  if (bVar49) {
                    pcVar37 = "%s slams against the door.";
                  }
                  msg(pcVar37,&local_1088);
                  square_set_door_lock((chunk *)cave,local_1100,wVar15 + L'\xffffffff');
                  bVar40 = extraout_AL;
                }
                if ((int)local_10e4 < iVar41) {
                  _Var11 = monster_is_visible(mon);
                  if (_Var11) {
                    plVar38 = (loc *)0x238ae6;
                    flag_on_dbg(pmVar26->flags,0xc,0x38,"lore->flags","RF_BASH_DOOR");
                  }
                  monster_slightly_stun_by_move(mon);
                  bVar40 = extraout_AL_00;
LAB_00181bea:
                  bVar44 = 0;
                }
                else {
                  bVar44 = 0;
                }
              }
              else {
                _Var11 = square_isview(cave,lVar24);
                if (_Var11) {
                  puVar2 = &player->upkeep->update;
                  *puVar2 = *puVar2 | 0xc0;
                }
                if (!bVar49) {
                  square_open_door(cave,local_1100);
                  bVar40 = extraout_AL_01;
                  goto LAB_00181bea;
                }
                square_smash_door(cave,local_1100);
                msg("You hear a door burst open!");
                disturb(player);
                bVar44 = 1;
                if ((int)local_10e4 < iVar41) {
                  _Var11 = monster_is_visible(mon);
                  if (_Var11) {
                    plVar38 = (loc *)0x238ae6;
                    flag_on_dbg(pmVar26->flags,0xc,0x38,"lore->flags","RF_BASH_DOOR");
                  }
                  monster_slightly_stun_by_move(mon);
                }
                bVar40 = 1;
              }
            }
            _Var11 = (_Bool)(bVar44 & bVar40);
            goto LAB_00180c6f;
          }
          square_destroy_wall(cave,local_1100);
          _Var12 = square_isview(cave,lVar24);
          if (!_Var12) goto LAB_00180c6f;
        }
        puVar2 = &player->upkeep->update;
        *puVar2 = *puVar2 | 0xc0;
      }
    }
    else {
LAB_00180c6c:
      _Var11 = false;
    }
LAB_00180c6f:
    lVar24 = local_1100;
    iVar41 = 7;
    lVar48 = local_10f0;
    if (_Var11 != false) {
      _Var11 = square_iswarded(cave,local_1100);
      lVar48 = local_10f0;
      if (_Var11) {
        _Var11 = square_iswarded(cave,lVar24);
        if (!_Var11) {
          __assert_fail("square_iswarded(cave, new)",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-move.c"
                        ,0x598,"_Bool monster_turn_attack_glyph(struct monster *, struct loc)");
        }
        uVar18 = Rand_div((uint)z_info->glyph_hardness);
        wVar15 = mon->race->level;
        if (uVar18 + L'\x01' < wVar15) {
          ptVar23 = lookup_trap("glyph of warding");
          _Var11 = square_isseen(cave,local_1100);
          if (_Var11) {
            msg("The rune of protection is broken!");
          }
          lVar24 = local_1100;
          if (ptVar23 == (trap_kind_conflict *)0x0) {
            __assert_fail("rune",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-move.c"
                          ,0x5a4,"_Bool monster_turn_attack_glyph(struct monster *, struct loc)");
          }
          square_remove_all_traps_of_type((chunk *)cave,local_1100,ptVar23->tidx);
          iVar41 = 7;
          uVar43 = local_10b8;
          lVar48 = local_10f0;
          if (uVar18 + L'\x01' < wVar15) goto LAB_00180d53;
        }
        else {
          iVar41 = 7;
        }
      }
      else {
LAB_00180d53:
        lVar48 = local_10f0;
        iVar41 = 7;
        _Var11 = square_isdecoyed(cave,lVar24);
        if (_Var11) {
          _Var11 = monster_is_visible(mon);
          if (_Var11) {
            flag_on_dbg((bitflag *)local_10a0,0xc,0x1a,"lore->flags","RF_NEVER_BLOW");
          }
          _Var11 = flag_has_dbg(mon->race->flags,0xc,0x1a,"mon->race->flags","RF_NEVER_BLOW");
          if (!_Var11) {
            square_destroy_decoy(cave,local_1100);
            uVar35 = extraout_var;
LAB_00180dce:
            iVar41 = 5;
            local_1108.x = (int)CONCAT71(uVar35,1);
          }
        }
        else {
          _Var11 = square_isplayer(cave,lVar24);
          if (_Var11) {
            if ((mon->target).midx == -1) {
              _Var11 = monster_is_visible(mon);
              if (_Var11) {
                flag_on_dbg((bitflag *)local_10a0,0xc,0x1a,"lore->flags","RF_NEVER_BLOW");
              }
              _Var11 = flag_has_dbg(mon->race->flags,0xc,0x1a,"mon->race->flags","RF_NEVER_BLOW");
              if (!_Var11) {
                make_attack_normal((monster_conflict *)mon,player);
                uVar35 = extraout_var_00;
                goto LAB_00180dce;
              }
            }
            else {
LAB_00180f1f:
              lVar24 = local_1100;
              pmVar31 = square_monster(cave,local_1100);
              if (pmVar31 == (monster *)0x0) {
                grid1_03.x = (mon->grid).x;
                grid1_03.y = (mon->grid).y;
                monster_swap(grid1_03,lVar24);
                _Var11 = square_ismonstertrap(cave,lVar24);
                local_1108.x = (int)CONCAT71((int7)((ulong)plVar38 >> 8),1);
                if (_Var11) {
                  monster_hit_trap((monster_conflict *)mon,lVar24,&local_1109);
                }
              }
              else {
                pmVar31 = square_monster(cave,lVar24);
                pmVar32 = cave_monster(cave,(mon->target).midx);
                if (pmVar31 == pmVar32) {
                  pmVar27 = (monster_conflict *)cave_monster(cave,(mon->target).midx);
                  monster_attack_monster((monster_conflict *)mon,pmVar27);
                  lVar48 = local_10f0;
                }
                else {
                  pmVar27 = (monster_conflict *)square_monster(cave,lVar24);
                  pmVar26 = get_lore(mon->race);
                  _Var11 = monster_can_kill(mon,(loc_conflict)lVar24);
                  _Var12 = monster_can_move(mon,(loc_conflict)lVar24);
                  if (_Var12) {
                    grid_03.x = (mon->grid).x;
                    grid_03.y = (mon->grid).y;
                    _Var12 = square_ispassable(cave,grid_03);
                    uVar35 = extraout_var_01;
                  }
                  else {
                    _Var12 = false;
                    uVar35 = 0;
                  }
                  uVar22 = (undefined4)CONCAT71(uVar35,_Var12 | _Var11);
                  local_1108.x = uVar22;
                  if ((_Var12 | _Var11) != 0) {
                    monster_desc((char *)local_1038,0x50,(monster *)pmVar27,L'\x04');
                    _Var12 = monster_is_visible(mon);
                    if (_Var12) {
                      flag_on_dbg(pmVar26->flags,0xc,0x3d,"lore->flags","RF_KILL_BODY");
                      lVar24 = local_1100;
                      flag_on_dbg(pmVar26->flags,0xc,0x3c,"lore->flags","RF_MOVE_BODY");
                    }
                    _Var12 = monster_is_camouflaged((monster *)pmVar27);
                    if (_Var12) {
                      become_aware((chunk *)cave,pmVar27);
                    }
                    _Var12 = monster_is_visible(mon);
                    if ((_Var12) && (_Var12 = monster_is_in_view(mon), _Var12)) {
                      pcVar37 = "pushes past";
                      if (_Var11) {
                        pcVar37 = "tramples over";
                      }
                      msg("%s %s %s.",&local_1088,pcVar37,local_1038);
                    }
                    if (_Var11) {
                      delete_monster((chunk *)cave,lVar24);
                    }
                    grid1_04.x = (mon->grid).x;
                    grid1_04.y = (mon->grid).y;
                    monster_swap(grid1_04,lVar24);
                    _Var11 = square_ismonstertrap(cave,lVar24);
                    if (_Var11) {
                      monster_hit_trap((monster_conflict *)mon,lVar24,&local_1109);
                    }
                  }
                  local_1108 = (loc)(CONCAT44(local_1108.y,local_1108.x) & 0xffffffffffffff01);
                  lVar48 = local_10f0;
                }
              }
              lVar24 = local_1100;
              iVar41 = 1;
              if (local_1109 == false) {
                pmVar31 = square_monster(cave,local_1100);
                if (pmVar31 == mon) {
                  pmVar26 = get_lore(mon->race);
                  _Var11 = monster_is_visible(mon);
                  for (poVar33 = square_object(cave,lVar24); poVar33 != (object *)0x0;
                      poVar33 = poVar33->next) {
                    _Var12 = tval_is_money(poVar33);
                    if (!_Var12 && _Var11) {
                      flag_on_dbg(pmVar26->flags,0xc,0x3e,"lore->flags","RF_TAKE_ITEM");
                      flag_on_dbg(pmVar26->flags,0xc,0x3f,"lore->flags","RF_KILL_ITEM");
                      break;
                    }
                  }
                  _Var12 = flag_has_dbg(mon->race->flags,0xc,0x3e,"mon->race->flags","RF_TAKE_ITEM")
                  ;
                  if ((_Var12) ||
                     (_Var12 = flag_has_dbg(mon->race->flags,0xc,0x3f,"mon->race->flags",
                                            "RF_KILL_ITEM"), lVar48 = local_10f0, _Var12)) {
                    poVar33 = square_object(cave,local_1100);
joined_r0x00181710:
                    obj = poVar33;
                    lVar48 = local_10f0;
                    if (obj != (object *)0x0) {
                      paVar9 = obj->artifact;
                      poVar33 = obj->next;
                      _Var12 = tval_is_money(obj);
                      if ((!_Var12) && (obj->mimicking_m_idx == 0)) {
                        object_desc((char *)local_1038,0x50,obj,0x43,player);
                        _Var12 = react_to_slay(obj,(monster_conflict *)mon);
                        local_10c8 = (bitflag *)CONCAT71(local_10c8._1_7_,_Var12);
                        _Var12 = flag_has_dbg(mon->race->flags,0xc,0x3e,"mon->race->flags",
                                              "RF_TAKE_ITEM");
                        if (((char)local_10c8 != '\0') || (paVar9 != (artifact *)0x0)) {
                          if (((_Var12 && _Var11) &&
                              (_Var12 = square_isview(cave,local_1100), _Var12)) &&
                             (_Var12 = ignore_item_ok(player,obj), !_Var12)) {
                            msg("%s tries to pick up %s, but fails.",&local_1088,local_1038);
                          }
                          goto joined_r0x00181710;
                        }
                        if (_Var12) {
                          local_1098 = object_new();
                          object_copy(local_1098,obj);
                          local_1098->oidx = 0;
                          if (obj->known != (object *)0x0) {
                            poVar34 = object_new();
                            local_1098->known = poVar34;
                            object_copy(poVar34,obj->known);
                            poVar34 = local_1098->known;
                            poVar34->oidx = 0;
                            lVar24 = (loc)loc(0,0);
                            poVar34->grid = lVar24;
                          }
                          _Var12 = monster_carry((chunk *)cave,(monster_conflict *)mon,local_1098);
                          if (!_Var12) {
                            if (local_1098->known != (object *)0x0) {
                              object_delete((chunk *)player->cave,(chunk *)0x0,&local_1098->known);
                            }
                            object_delete((chunk *)cave,(chunk *)player->cave,&local_1098);
                            goto joined_r0x00181710;
                          }
                          _Var12 = square_isseen(cave,local_1100);
                          if ((_Var12) && (_Var12 = ignore_item_ok(player,obj), !_Var12)) {
                            msg("%s picks up %s.",&local_1088,local_1038);
                          }
                        }
                        else {
                          _Var12 = square_isseen(cave,local_1100);
                          if ((_Var12) && (_Var12 = ignore_item_ok(player,obj), !_Var12)) {
                            msgt(0x21,"%s crushes %s.",&local_1088,local_1038);
                          }
                        }
                        square_delete_object(cave,local_1100,obj,true,true);
                      }
                      goto joined_r0x00181710;
                    }
                  }
                }
                iVar41 = 0;
              }
            }
          }
          else {
            plVar38 = (loc *)0x22d200;
            _Var11 = flag_has_dbg(mon->race->flags,0xc,0x1b,"mon->race->flags","RF_NEVER_MOVE");
            if (!_Var11) goto LAB_00180f1f;
            _Var11 = monster_is_visible(mon);
            iVar41 = 1;
            if (_Var11) {
              flag_on_dbg((bitflag *)local_10a0,0xc,0x1b,"lore->flags","RF_NEVER_MOVE");
            }
          }
        }
      }
    }
  }
  else {
    grid_02.x = (mon->grid).x;
    grid_02.y = (mon->grid).y;
    _Var11 = square_isview(cave,grid_02);
    iVar41 = 5;
    if ((_Var11 | (byte)local_10e0.x) == 1) goto LAB_00180b24;
  }
  if ((iVar41 == 0) || (iVar41 == 7)) {
    if ((3 < (ulong)lVar48) || (lVar48 = (loc)((long)lVar48 + 1), ((ulong)local_1108 & 1) != 0))
    goto LAB_00181c06;
    goto LAB_00180ab5;
  }
  if (iVar41 != 5) {
    return;
  }
LAB_00181c06:
  if (((ulong)local_1108 & 1) != 0) {
    _Var11 = monster_is_visible(mon);
    if (_Var11) {
      flag_on_dbg((bitflag *)local_10a0,0xc,0x1b,"lore->flags","RF_NEVER_MOVE");
    }
    _Var11 = monster_is_visible(mon);
    lVar24 = local_1108;
    if (((_Var11) && (_Var11 = monster_is_in_view(mon), _Var11)) && ((player->opts).opt[10] == true)
       ) {
      disturb(player);
    }
    if (((ulong)lVar24 & 1) != 0) goto LAB_00181cb6;
  }
  sVar4 = mon->m_timed[3];
  if (sVar4 != 0) {
    mon_clear_timed(mon,L'\x03',L'\x04');
    mon_inc_timed(mon,L'\x06',(int)sVar4,L'\x01');
  }
  if (((ulong)local_1108 & 1) == 0) {
    return;
  }
LAB_00181cb6:
  _Var11 = monster_is_camouflaged(mon);
  if (_Var11) {
    become_aware((chunk *)cave,(monster_conflict *)mon);
  }
  return;
}

Assistant:

static void monster_turn(struct monster *mon)
{
	struct monster_lore *lore = get_lore(mon->race);

	bool did_something = false;

	int i;
	int dir = 0;
	enum monster_stagger stagger;
	bool tracking = false;
	bool dead = false;
	char m_name[80];

	/* Get the monster name */
	monster_desc(m_name, sizeof(m_name), mon,
		MDESC_CAPITAL | MDESC_IND_HID | MDESC_COMMA);

	/* If we're in a web, deal with that */
	if (square_iswebbed(cave, mon->grid)) {
		/* Learn web behaviour */
		if (monster_is_visible(mon)) {
			rf_on(lore->flags, RF_CLEAR_WEB);
			rf_on(lore->flags, RF_PASS_WEB);
		}

		/* If we can pass, no need to clear */
		if (!rf_has(mon->race->flags, RF_PASS_WEB)) {
			/* Learn wall behaviour */
			if (monster_is_visible(mon)) {
				rf_on(lore->flags, RF_PASS_WALL);
				rf_on(lore->flags, RF_KILL_WALL);
			}

			/* Now several possibilities */
			if (rf_has(mon->race->flags, RF_PASS_WALL)) {
				/* Insubstantial monsters go right through */
			} else if (monster_passes_walls(mon)) {
				/* If you can destroy a wall, you can destroy a web */
				struct trap_kind *web = lookup_trap("web");

				assert(web);
				square_remove_all_traps_of_type(cave,
					mon->grid, web->tidx);
			} else if (rf_has(mon->race->flags, RF_CLEAR_WEB)) {
				/* Clearing costs a turn (assume there are no other "traps") */
				struct trap_kind *web = lookup_trap("web");

				assert(web);
				square_remove_all_traps_of_type(cave,
					mon->grid, web->tidx);
				return;
			} else {
				/* Stuck */
				return;
			}
		}
	}

	/* Handle territorial monsters */
	if (rf_has(mon->race->flags, RF_TERRITORIAL) &&
		(level_topography(player->place) != TOP_CAVE)) {
		/* Territorial monsters get a direct energy boost when close to home */
		int from_home =	distance(mon->home, mon->grid);

		/* Step up in units of a fifth of monster detection range */
		for (i = 5; i > 0; i--) {
			if ((from_home * i) > (mon->race->hearing * 5))
				break;
		}

		/* Add some energy */
		mon->energy += (5 - i);

		/* If target is too far away from home, go back */
		if (distance(mon->home, mon->target.grid) >	5 * mon->race->hearing) {
			mon->target.grid = mon->home;
		}
	}

	/* Let other group monsters know about the player */
	monster_group_rouse(cave, mon);

	/* Try to multiply - this can use up a turn */
	if (monster_turn_multiply(mon))
		return;

	/* Monsters can speak.  -originally by TY- */
	if (one_in_(16) && rf_has(mon->race->flags, RF_SPEAKING) &&
		los(cave, mon->grid, player->grid) && !mon->m_timed[MON_TMD_FEAR]) {
		char bravado[80];

		/* Acquire the monster name/poss */
		if (monster_is_visible(mon)) {
			monster_desc(m_name, sizeof(m_name), mon, MDESC_CAPITAL);
		} else {
			strcpy(m_name, "It");
		}

		if (!get_rnd_line("bravado.txt", bravado)) {
			msg("%s %s", m_name, bravado);
		}
	} else if (rf_has(mon->race->flags, RF_PLAYER_GHOST)) {
		assert(cave->ghost);
		if (square_isview(cave, mon->grid) && (cave->ghost->string_type == 1)
			&& !cave->ghost->has_spoken && one_in_(3)) {
			/* Player ghosts may have a unique message they can say. */
			char ghost_name[80];

			/* Acquire the monster name/poss.  The player ghost will 
			 * always be identified, to heighten the effect.*/
			monster_desc(ghost_name, sizeof(ghost_name), mon, MDESC_SHOW);

			msg("%s says: '%s'", ghost_name, cave->ghost->string);
			cave->ghost->has_spoken = true;
		}
	}

	/* Attempt a ranged attack */
	if (make_ranged_attack(mon)) return;

	/* Work out what kind of movement to use - random movement or AI */
	stagger = monster_turn_should_stagger(mon);
	if (stagger == NO_STAGGER) {
		/* If there's no sensible move, we're done */
		if (!get_move(mon, &dir, &tracking)) return;
	}

	/* Try to move first in the chosen direction, or next either side of the
	 * chosen direction, or next at right angles to the chosen direction.
	 * Monsters which are tracking by sound or scent will not move if they
	 * can't move in their chosen direction. */
	for (i = 0; i < 5 && !did_something; i++) {
		/* Get the direction (or stagger) */
		int d = (stagger != NO_STAGGER) ? ddd[randint0(8)] : side_dirs[dir][i];

		/* Get the grid to step to or attack */
		struct loc new = loc_sum(mon->grid, ddgrid[d]);

		/* Tracking monsters have their best direction, don't change */
		if ((i > 0) && stagger == NO_STAGGER &&
			!square_isview(cave, mon->grid) && tracking) {
			break;
		}

		/* Check if we can move */
		if (!monster_turn_can_move(mon, m_name, new,
								   stagger == CONFUSED_STAGGER, &did_something))
			continue;

		/* Try to break the glyph if there is one.  This can happen multiple
		 * times per turn because failure does not break the loop */
		if (square_iswarded(cave, new) && !monster_turn_attack_glyph(mon, new))
			continue;

		/* Break a decoy if there is one */
		if (square_isdecoyed(cave, new)) {
			/* Learn about if the monster attacks */
			if (monster_is_visible(mon))
				rf_on(lore->flags, RF_NEVER_BLOW);

			/* Some monsters never attack */
			if (rf_has(mon->race->flags, RF_NEVER_BLOW))
				continue;

			/* Wait a minute... */
			square_destroy_decoy(cave, new);
			did_something = true;
			break;
		}

		/* The player is in the way. */
		if (square_isplayer(cave, new)) {
			if (mon->target.midx == -1) {
				/* Learn about if the monster attacks */
				if (monster_is_visible(mon))
					rf_on(lore->flags, RF_NEVER_BLOW);

				/* Some monsters never attack */
				if (rf_has(mon->race->flags, RF_NEVER_BLOW))
					continue;

				/* Otherwise, attack the player */
				make_attack_normal(mon, player);

				did_something = true;
				break;
			} else {
				/* Don't want to attack, so look for other options */
			}
		} else {
			/* Some monsters never move */
			if (rf_has(mon->race->flags, RF_NEVER_MOVE)) {
				/* Learn about lack of movement */
				if (monster_is_visible(mon))
					rf_on(lore->flags, RF_NEVER_MOVE);

				return;
			}
		}

		/* A monster is in the way, try to push past/kill */
		if (square_monster(cave, new)) {
			if (square_monster(cave, new) == cave_monster(cave,
														  mon->target.midx)) {
				monster_attack_monster(mon,
									   cave_monster(cave, mon->target.midx));
			} else {
				did_something = monster_turn_try_push(mon, m_name, new, &dead);
			}
		} else {
			/* Otherwise we can just move */
			monster_swap(mon->grid, new);

			/* Check for monster traps */
			if (square_ismonstertrap(cave, new)) {
				monster_hit_trap(mon, new, &dead);
			}
			did_something = true;
		}

		/* Monster may have died */
		if (dead) return;

		/* Scan all objects in the grid, if we reached it */
		if (mon == square_monster(cave, new)) {
			monster_turn_grab_objects(mon, m_name, new);
		}
	}

	if (did_something) {
		/* Learn about no lack of movement */
		if (monster_is_visible(mon))
			rf_on(lore->flags, RF_NEVER_MOVE);

		/* Possible disturb */
		if (monster_is_visible(mon) && monster_is_in_view(mon) && 
			OPT(player, disturb_near))
			disturb(player);		
	}

	/* Out of options - monster is paralyzed by fear (unless attacked) */
	if (!did_something && mon->m_timed[MON_TMD_FEAR]) {
		int amount = mon->m_timed[MON_TMD_FEAR];
		mon_clear_timed(mon, MON_TMD_FEAR, MON_TMD_FLG_NOMESSAGE);
		mon_inc_timed(mon, MON_TMD_HOLD, amount, MON_TMD_FLG_NOTIFY);
	}

	/* If we see an unaware monster do something, become aware of it */
	if (did_something && monster_is_camouflaged(mon))
		become_aware(cave, mon);
}